

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,int opNum,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  uint RegNo;
  sparc_reg sVar3;
  MCOperand *op;
  uint8_t *puVar4;
  int64_t iVar5;
  MCOperand *MO;
  uint reg;
  int Imm;
  SStream *O_local;
  int opNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,opNum);
  _Var2 = MCOperand_isReg(op);
  if (_Var2) {
    RegNo = MCOperand_getReg(op);
    printRegName(O,RegNo);
    sVar3 = Sparc_map_register(RegNo);
    if (MI->csh->detail != CS_OPT_OFF) {
      if ((MI->csh->doing_mem & 1U) == 0) {
        puVar4 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1a;
        puVar4[0] = '\x01';
        puVar4[1] = '\0';
        puVar4[2] = '\0';
        puVar4[3] = '\0';
        *(sparc_reg *)
         (MI->flat_insn->detail->groups +
         (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e) = sVar3;
        pcVar1 = MI->flat_insn->detail;
        (pcVar1->field_6).x86.rex = (pcVar1->field_6).x86.rex + '\x01';
      }
      else if (MI->flat_insn->detail->groups
               [(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e] == '\0') {
        MI->flat_insn->detail->groups[(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e]
             = (uint8_t)sVar3;
      }
      else {
        MI->flat_insn->detail->groups[(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1f]
             = (uint8_t)sVar3;
      }
    }
  }
  else {
    _Var2 = MCOperand_isImm(op);
    if (_Var2) {
      iVar5 = MCOperand_getImm(op);
      MO._4_4_ = (uint)iVar5;
      if (MI->Opcode == 0x72) {
        MO._4_4_ = (int)MI->address + MO._4_4_;
      }
      else if (MI->flat_insn->id == 0x10) {
        MO._4_4_ = (int)MI->address + MO._4_4_ * 4;
      }
      if ((int)MO._4_4_ < 0) {
        if ((int)MO._4_4_ < -9) {
          SStream_concat(O,"-0x%x",(ulong)-MO._4_4_);
        }
        else {
          SStream_concat(O,"-%u",(ulong)-MO._4_4_);
        }
      }
      else if ((int)MO._4_4_ < 10) {
        SStream_concat(O,"%u",(ulong)MO._4_4_);
      }
      else {
        SStream_concat(O,"0x%x",(ulong)MO._4_4_);
      }
      if (MI->csh->detail != CS_OPT_OFF) {
        if ((MI->csh->doing_mem & 1U) == 0) {
          puVar4 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1a;
          puVar4[0] = '\x02';
          puVar4[1] = '\0';
          puVar4[2] = '\0';
          puVar4[3] = '\0';
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e) = MO._4_4_;
          pcVar1 = MI->flat_insn->detail;
          (pcVar1->field_6).x86.rex = (pcVar1->field_6).x86.rex + '\x01';
        }
        else {
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x22) = MO._4_4_;
        }
      }
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, int opNum, SStream *O)
{
	int Imm;
	unsigned reg;
	MCOperand *MO = MCInst_getOperand(MI, opNum);

	if (MCOperand_isReg(MO)) {
		reg = MCOperand_getReg(MO);
		printRegName(O, reg);
		reg = Sparc_map_register(reg);

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				if (MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base)
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.index = reg;
				else
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_REG;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].reg = reg;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}

		return;
	}

	if (MCOperand_isImm(MO)) {
		Imm = (int)MCOperand_getImm(MO);

		// get absolute address for CALL/Bxx
		if (MI->Opcode == SP_CALL)
			Imm += (uint32_t)MI->address;
		else if (MI->flat_insn->id == SPARC_INS_B)
			// pc + (disp30 * 4)
			Imm = (uint32_t)MI->address + Imm * 4;

		if (Imm >= 0) {
			if (Imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", Imm);
			else
				SStream_concat(O, "%u", Imm);
		} else {
			if (Imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -Imm);
			else
				SStream_concat(O, "-%u", -Imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.disp = Imm;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_IMM;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].imm = Imm;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}
	}

	return;
}